

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O1

uv_signal_t * uv__signal_first_handle(int signum)

{
  uv__signal_tree_s uVar1;
  uv_signal_s *puVar2;
  uv_signal_s *puVar3;
  uint uVar4;
  long lVar5;
  uv_signal_t lookup;
  
  puVar2 = (uv_signal_s *)0x0;
  puVar3 = puVar2;
  if (uv__signal_tree.rbh_root != (uv_signal_s *)0x0) {
    uVar1.rbh_root = uv__signal_tree.rbh_root;
    do {
      puVar3 = uVar1.rbh_root;
      if (signum < puVar3->signum) {
LAB_0010e936:
        uVar4 = 0xffffffff;
      }
      else {
        uVar4 = 1;
        if (signum <= puVar3->signum) {
          if (&lookup < puVar3) goto LAB_0010e936;
          uVar4 = 0xffffffff;
          if (puVar3->loop == (uv_loop_t *)0x0) {
            uVar4 = (uint)(puVar3 < &lookup);
          }
        }
      }
      if ((int)uVar4 < 0) {
        lVar5 = 0x50;
        puVar2 = puVar3;
      }
      else {
        lVar5 = 0x58;
        if (uVar4 == 0) break;
      }
      uVar1.rbh_root = *(uv_signal_s **)((long)puVar3->handle_queue + lVar5 + -0x20);
      puVar3 = puVar2;
    } while (uVar1.rbh_root != (uv_signal_s *)0x0);
  }
  if ((puVar3 == (uv_signal_s *)0x0) || (puVar3->signum != signum)) {
    puVar3 = (uv_signal_t *)0x0;
  }
  return puVar3;
}

Assistant:

static uv_signal_t* uv__signal_first_handle(int signum) {
  /* This function must be called with the signal lock held. */
  uv_signal_t lookup;
  uv_signal_t* handle;

  lookup.signum = signum;
  lookup.loop = NULL;

  handle = RB_NFIND(uv__signal_tree_s, &uv__signal_tree, &lookup);

  if (handle != NULL && handle->signum == signum)
    return handle;

  return NULL;
}